

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-getsockname.c
# Opt level: O1

int run_test_pipe_getsockname_abstract(void)

{
  uint __fd;
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_pipe_t *loop;
  size_t len;
  sockaddr_un sun;
  char buf [1024];
  size_t local_490;
  sockaddr local_488;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 uStack_438;
  undefined6 uStack_430;
  undefined2 local_42a;
  undefined6 uStack_428;
  undefined8 uStack_422;
  undefined3 local_418;
  undefined5 uStack_415;
  undefined3 uStack_410;
  
  loop = (uv_pipe_t *)0x1;
  __fd = socket(1,1,0);
  if (__fd == 0xffffffff) {
    run_test_pipe_getsockname_abstract_cold_8();
LAB_0016344b:
    run_test_pipe_getsockname_abstract_cold_1();
LAB_00163450:
    run_test_pipe_getsockname_abstract_cold_2();
LAB_00163455:
    run_test_pipe_getsockname_abstract_cold_3();
LAB_0016345a:
    run_test_pipe_getsockname_abstract_cold_4();
LAB_0016345f:
    run_test_pipe_getsockname_abstract_cold_5();
  }
  else {
    local_488.sa_data[0xb] = '\0';
    local_488.sa_data[0xc] = '\0';
    local_488.sa_data[0xd] = '\0';
    uStack_428 = 0;
    uStack_422 = 0;
    uStack_438 = 0;
    uStack_430 = 0;
    local_42a = 0;
    local_448 = 0;
    uStack_440 = 0;
    local_458 = 0;
    uStack_450 = 0;
    local_468 = 0;
    uStack_460 = 0;
    local_478 = 0;
    uStack_470 = 0;
    local_488.sa_family = 1;
    local_488.sa_data[0] = '\0';
    local_488.sa_data[1] = 't';
    local_488.sa_data[2] = 'e';
    local_488.sa_data[3] = 's';
    local_488.sa_data[4] = 't';
    local_488.sa_data[5] = '-';
    local_488.sa_data[6] = 'p';
    local_488.sa_data[7] = 'i';
    local_488.sa_data[8] = 'p';
    local_488.sa_data[9] = 'e';
    local_488.sa_data[10] = '\0';
    loop = (uv_pipe_t *)(ulong)__fd;
    iVar1 = bind(__fd,&local_488,0x6e);
    if (iVar1 != 0) goto LAB_0016344b;
    loop = (uv_pipe_t *)uv_default_loop();
    iVar1 = uv_pipe_init((uv_loop_t *)loop,&pipe_server,0);
    if (iVar1 != 0) goto LAB_00163450;
    loop = &pipe_server;
    iVar1 = uv_pipe_open(&pipe_server,__fd);
    if (iVar1 != 0) goto LAB_00163455;
    local_490 = 0x400;
    loop = &pipe_server;
    iVar1 = uv_pipe_getsockname(&pipe_server,(char *)&local_418,&local_490);
    if (iVar1 != 0) goto LAB_0016345a;
    if (CONCAT35(uStack_410,uStack_415) != 0x657069702d7473 ||
        CONCAT53(uStack_415,local_418) != 0x69702d7473657400) goto LAB_0016345f;
    uv_close((uv_handle_t *)&pipe_server,pipe_close_cb);
    puVar2 = uv_default_loop();
    uv_run(puVar2,UV_RUN_DEFAULT);
    loop = (uv_pipe_t *)(ulong)__fd;
    close(__fd);
    if (pipe_close_cb_called == 1) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      loop = (uv_pipe_t *)uv_default_loop();
      iVar1 = uv_loop_close((uv_loop_t *)loop);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00163469;
    }
  }
  run_test_pipe_getsockname_abstract_cold_6();
LAB_00163469:
  run_test_pipe_getsockname_abstract_cold_7();
  if (loop == &pipe_server || loop == &pipe_client) {
    pipe_close_cb_called = pipe_close_cb_called + 1;
    return (int)CONCAT71(0x3288,loop == &pipe_client);
  }
  pipe_close_cb_cold_1();
  puVar2 = uv_default_loop();
  uv_walk(puVar2,close_walk_cb,(void *)0x0);
  uv_run(puVar2,UV_RUN_DEFAULT);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 == 0) {
    return 0;
  }
  run_test_pipe_getsockname_blocking_cold_1();
  iVar1 = uv_is_closing((uv_handle_t *)puVar2);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)puVar2,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(pipe_getsockname_abstract) {
#if defined(__linux__)
  char buf[1024];
  size_t len;
  int r;
  int sock;
  struct sockaddr_un sun;
  socklen_t sun_len;
  char abstract_pipe[] = "\0test-pipe";

  sock = socket(AF_UNIX, SOCK_STREAM, 0);
  ASSERT(sock != -1);

  sun_len = sizeof sun;
  memset(&sun, 0, sun_len);
  sun.sun_family = AF_UNIX;
  memcpy(sun.sun_path, abstract_pipe, sizeof abstract_pipe);

  r = bind(sock, (struct sockaddr*)&sun, sun_len);
  ASSERT(r == 0);

  r = uv_pipe_init(uv_default_loop(), &pipe_server, 0);
  ASSERT(r == 0);
  r = uv_pipe_open(&pipe_server, sock);
  ASSERT(r == 0);

  len = sizeof buf;
  r = uv_pipe_getsockname(&pipe_server, buf, &len);
  ASSERT(r == 0);

  ASSERT(memcmp(buf, abstract_pipe, sizeof abstract_pipe) == 0);

  uv_close((uv_handle_t*)&pipe_server, pipe_close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  close(sock);

  ASSERT(pipe_close_cb_called == 1);
  MAKE_VALGRIND_HAPPY();
  return 0;
#else
  MAKE_VALGRIND_HAPPY();
  return 0;
#endif
}